

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkroom.c
# Opt level: O0

void mkgarden(level *lev,mkroom *croom)

{
  boolean bVar1;
  int iVar2;
  permonst *ptr;
  monst *pmVar3;
  bool bVar4;
  mkroom *local_50;
  monst *mtmp;
  permonst *pmon;
  mkroom *sroom;
  int tried;
  int i;
  coord pos;
  boolean maderoom;
  mkroom *pmStack_18;
  int tryct;
  mkroom *croom_local;
  level *lev_local;
  
  i = 0;
  tried._3_1_ = '\0';
  pmStack_18 = croom;
  while (i < 0x19 && tried._3_1_ == '\0') {
    if (pmStack_18 == (mkroom *)0x0) {
      i = i + 1;
      iVar2 = rn2(lev->nroom);
      local_50 = lev->rooms + iVar2;
    }
    else {
      local_50 = pmStack_18;
      i = i + 1;
    }
    if ((-1 < local_50->hx) &&
       ((pmStack_18 != (mkroom *)0x0 ||
        ((((local_50->rtype == '\0' && (local_50->rlit != '\0')) &&
          (bVar1 = has_upstairs(lev,local_50), bVar1 == '\0')) &&
         (bVar1 = has_dnstairs(lev,local_50), bVar1 == '\0')))))) {
      local_50->rtype = '\x0e';
      tried._3_1_ = '\x01';
      *(uint *)&(lev->flags).field_0x8 = *(uint *)&(lev->flags).field_0x8 & 0xffffffdf | 0x20;
      sroom._0_4_ = 0;
      iVar2 = rn2(5);
      sroom._4_4_ = iVar2 + 3;
      while( true ) {
        iVar2 = (int)sroom + 1;
        bVar4 = false;
        if (((int)sroom < 0x32) && (bVar4 = false, -1 < sroom._4_4_)) {
          bVar1 = somexy(lev,local_50,(coord *)((long)&tried + 1));
          bVar4 = bVar1 != '\0';
        }
        if (!bVar4) break;
        sroom._0_4_ = iVar2;
        if (((lev->monsters[tried._1_1_][tried._2_1_] == (monst *)0x0) ||
            ((*(uint *)&lev->monsters[tried._1_1_][tried._2_1_]->field_0x60 >> 9 & 1) != 0)) &&
           (ptr = mkclass(&lev->z,'\x0e',0), ptr != (permonst *)0x0)) {
          pmVar3 = makemon(ptr,lev,(int)tried._1_1_,(int)tried._2_1_,0);
          if (pmVar3 != (monst *)0x0) {
            *(uint *)&pmVar3->field_0x60 = *(uint *)&pmVar3->field_0x60 & 0xfff7ffff | 0x80000;
          }
          sroom._4_4_ = sroom._4_4_ + -1;
        }
      }
      sroom._0_4_ = 0;
      iVar2 = rn2(3);
      sroom._4_4_ = iVar2 + 3;
      while( true ) {
        iVar2 = (int)sroom + 1;
        bVar4 = false;
        if (((int)sroom < 0x32) && (bVar4 = false, -1 < sroom._4_4_)) {
          bVar1 = somexy(lev,local_50,(coord *)((long)&tried + 1));
          bVar4 = bVar1 != '\0';
        }
        if (!bVar4) break;
        sroom._0_4_ = iVar2;
        if ((lev->locations[tried._1_1_][tried._2_1_].typ == '\x19') &&
           (((lev->monsters[tried._1_1_][tried._2_1_] == (monst *)0x0 ||
             ((*(uint *)&lev->monsters[tried._1_1_][tried._2_1_]->field_0x60 >> 9 & 1) != 0)) &&
            (bVar1 = nexttodoor(lev,(int)tried._1_1_,(int)tried._2_1_), bVar1 == '\0')))) {
          iVar2 = rn2(3);
          if (iVar2 == 0) {
            lev->locations[tried._1_1_][tried._2_1_].typ = '\x1c';
            (lev->flags).nfountains = (lev->flags).nfountains + '\x01';
          }
          else {
            lev->locations[tried._1_1_][tried._2_1_].typ = '\r';
          }
          sroom._4_4_ = sroom._4_4_ + -1;
        }
      }
    }
  }
  return;
}

Assistant:

static void mkgarden(struct level *lev, struct mkroom *croom)
{
	int tryct = 0;
	boolean maderoom = FALSE;
	coord pos;
	int i, tried;

	while ((tryct++ < 25) && !maderoom) {
	    struct mkroom *sroom = croom ? croom : &lev->rooms[rn2(lev->nroom)];

	    if (sroom->hx < 0 || (!croom &&
		    (sroom->rtype != OROOM || !sroom->rlit ||
		    has_upstairs(lev, sroom) || has_dnstairs(lev, sroom))))
		continue;

	    sroom->rtype = GARDEN;
	    maderoom = TRUE;
	    lev->flags.has_garden = 1;

	    tried = 0;
	    i = rn1(5, 3);
	    while ((tried++ < 50) && (i >= 0) && somexy(lev, sroom, &pos)) {
		const struct permonst *pmon;
		if (!MON_AT(lev, pos.x, pos.y) && (pmon = mkclass(&lev->z, S_NYMPH, 0))) {
		    struct monst *mtmp = makemon(pmon, lev, pos.x, pos.y, NO_MM_FLAGS);
		    if (mtmp) mtmp->msleeping = 1;
		    i--;
		}
	    }

	    tried = 0;
	    i = rn1(3, 3);
	    while ((tried++ < 50) && (i >= 0) && somexy(lev, sroom, &pos)) {
		if (lev->locations[pos.x][pos.y].typ == ROOM && !MON_AT(lev, pos.x, pos.y) &&
			!nexttodoor(lev, pos.x, pos.y)) {
		    if (rn2(3)) {
			lev->locations[pos.x][pos.y].typ = TREE;
		    } else {
			lev->locations[pos.x][pos.y].typ = FOUNTAIN;
			lev->flags.nfountains++;
		    }
		    i--;
		}
	    }
	}
}